

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshShape.cpp
# Opt level: O1

void __thiscall
chrono::ChTriangleMeshShape::ArchiveIN(ChTriangleMeshShape *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  ChNameValue<std::shared_ptr<chrono::geometry::ChTriangleMeshConnected>_> local_48;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChTriangleMeshShape>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  local_48._value = &this->trimesh;
  local_48._name = "trimesh";
  local_48._flags = '\0';
  ChArchiveIn::in<chrono::geometry::ChTriangleMeshConnected>(marchive,&local_48);
  local_48._value = (shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)&this->wireframe;
  local_48._name = "wireframe";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_48);
  local_48._value = (shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)&this->backface_cull;
  local_48._name = "backface_cull";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_48);
  local_48._value = (shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)&this->name;
  local_48._name = "name";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x40))(marchive,&local_48);
  local_30.super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->scale;
  local_48._value = &local_30;
  local_30.super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)&PTR__ChFunctorArchiveIn_00b2ade0;
  local_48._name = "scale";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_48);
  return;
}

Assistant:

void ChTriangleMeshShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChTriangleMeshShape>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(trimesh);
    marchive >> CHNVP(wireframe);
    marchive >> CHNVP(backface_cull);
    marchive >> CHNVP(name);
    marchive >> CHNVP(scale);
}